

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto_test.h
# Opt level: O0

void upb_test::RoundTripDescriptor(FileDescriptorSet *set)

{
  bool bVar1;
  RepeatedPtrField<google::protobuf::FileDescriptorProto> *this;
  undefined1 local_1c0 [8];
  FileDescriptorProto mutable_file;
  FileDescriptorProto *file;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<google::protobuf::FileDescriptorProto> *__range1;
  undefined1 local_98 [8];
  DescriptorPool desc_pool;
  DefPool defpool;
  FileDescriptorSet *set_local;
  
  upb::DefPool::DefPool((DefPool *)&desc_pool.feature_set_defaults_spec_);
  google::protobuf::DescriptorPool::DescriptorPool((DescriptorPool *)local_98);
  google::protobuf::DescriptorPool::EnforceWeakDependencies((DescriptorPool *)local_98,true);
  this = google::protobuf::FileDescriptorSet::file(set);
  __end1 = google::protobuf::RepeatedPtrField<google::protobuf::FileDescriptorProto>::begin(this);
  file = (FileDescriptorProto *)
         google::protobuf::RepeatedPtrField<google::protobuf::FileDescriptorProto>::end(this);
  while( true ) {
    bVar1 = google::protobuf::internal::operator!=(&__end1,(iterator *)&file);
    if (!bVar1) break;
    mutable_file.field_0._224_8_ =
         google::protobuf::internal::
         RepeatedPtrIterator<const_google::protobuf::FileDescriptorProto>::operator*(&__end1);
    google::protobuf::FileDescriptorProto::FileDescriptorProto
              ((FileDescriptorProto *)local_1c0,(FileDescriptorProto *)mutable_file.field_0._224_8_)
    ;
    AddFile((FileDescriptorProto *)local_1c0,(DefPool *)&desc_pool.feature_set_defaults_spec_,
            (DescriptorPool *)local_98);
    google::protobuf::FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_1c0);
    google::protobuf::internal::RepeatedPtrIterator<const_google::protobuf::FileDescriptorProto>::
    operator++(&__end1);
  }
  google::protobuf::DescriptorPool::~DescriptorPool((DescriptorPool *)local_98);
  upb::DefPool::~DefPool((DefPool *)&desc_pool.feature_set_defaults_spec_);
  return;
}

Assistant:

inline void RoundTripDescriptor(const google::protobuf::FileDescriptorSet& set) {
  upb::DefPool defpool;
  google::protobuf::DescriptorPool desc_pool;
  desc_pool.EnforceWeakDependencies(true);
  for (const auto& file : set.file()) {
    google::protobuf::FileDescriptorProto mutable_file(file);
    AddFile(mutable_file, &defpool, &desc_pool);
  }
}